

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O2

int luaF_close(lua_State *L,StkId level,int status)

{
  anon_union_16_2_5131162a_for_u *paVar1;
  ushort uVar2;
  uint uVar3;
  UpVal *block;
  StkId pTVar4;
  UpVal *o;
  int iVar5;
  StkId pTVar6;
  TValue *func;
  long old_top;
  
  while( true ) {
    while( true ) {
      while( true ) {
        block = L->openupval;
        if ((block == (UpVal *)0x0) || (pTVar4 = block->v, pTVar4 < level)) {
          return status;
        }
        paVar1 = &block->u;
        if (pTVar4 == (StkId)paVar1) {
          __assert_fail("((uv)->v != &(uv)->u.value)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                        ,0x9f,"int luaF_close(lua_State *, StkId, int)");
        }
        L->openupval = (block->u).open.next;
        if (block->refcount != 0) break;
        func = block->v;
        uVar3 = block->flags;
        luaM_realloc_(L,block,0x20,0);
        if (((status != -1) && (uVar3 != 0)) && ((func->tt_ & 0xf) == 6)) {
          pTVar4 = L->stack;
          if (status == 0) {
            preparetocall(L,func,(TValue *)0x0);
            calldeferred(L,func);
            pTVar6 = L->stack;
            iVar5 = 0;
          }
          else {
            old_top = (long)func + (0x20 - (long)pTVar4);
            luaD_seterrorobj(L,status,func + 1);
            preparetocall(L,func,func + 1);
            iVar5 = luaD_pcall(L,calldeferred,(void *)0x0,old_top,0);
            pTVar6 = L->stack;
            if (status != -2 || iVar5 == 0) {
              L->top = (StkId)(old_top + (long)pTVar6);
              iVar5 = status;
            }
          }
          status = iVar5;
          level = (StkId)(((long)level - (long)pTVar4) + (long)pTVar6);
        }
      }
      o = (UpVal *)(pTVar4->value_).gc;
      (block->u).open.next = o;
      uVar2 = pTVar4->tt_;
      (block->u).value.tt_ = uVar2;
      if ((short)uVar2 < 0) break;
      block->v = (TValue *)paVar1;
    }
    if (((uVar2 & 0x7f) != (ushort)(byte)o->refcount) ||
       ((*(lu_byte *)((long)&o->refcount + 1) & (L->l_G->currentwhite ^ 0x18)) != 0)) break;
    block->v = (TValue *)paVar1;
    luaC_upvalbarrier_(L,(GCObject *)o);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                ,0xac,"int luaF_close(lua_State *, StkId, int)");
}

Assistant:

int luaF_close (lua_State *L, StkId level, int status) {
  UpVal *uv;
  while (L->openupval != NULL && (uv = L->openupval)->v >= level) {
    lua_assert(upisopen(uv));
    L->openupval = uv->u.open.next; /* remove from 'open' list */
    if (uv->refcount == 0) {        /* no references? */
      UpVal uv1 = *uv;              /* copy the upvalue as we will free it below */
      luaM_free(L, uv);             /* free upvalue before invoking any deferred functions */
      if (status != NOCLOSINGMETH && uv1.flags && ttisfunction(uv1.v)) {
        ptrdiff_t levelrel = savestack(L, level);
        status = calldeferredfunction(L, uv1.v, status);
        level = restorestack(L, levelrel);
      }
    }
    else {
      TValue* slot = &uv->u.value;  /* new position for value */
      setobj(L, slot, uv->v);  /* move value to upvalue slot */
      uv->v = slot;  /* now current value lives here */
      luaC_upvalbarrier(L, uv, slot);
    }
  }
  return status;
}